

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * evaluate_offsetof(dmr_C *C,expression *expr)

{
  int iVar1;
  int iVar2;
  expression *expr_00;
  symbol *psVar3;
  position pVar4;
  ident *piVar5;
  symbol *psVar6;
  anon_union_8_2_e1606681_for_symbol_12 aVar7;
  undefined4 uVar8;
  expression_list *sym;
  symbol *psVar9;
  symbol *psVar10;
  expression *peVar11;
  string *psVar12;
  symbol *psVar13;
  uint uVar14;
  int *in_RCX;
  char *pcVar15;
  long local_40;
  undefined1 local_34 [8];
  int offset;
  
  expr_00 = (expr->field_5).field_6.right;
  sym = (expr->field_5).expr_list;
  if (expr->op == 0x2e) {
    local_34._0_4_ = 0;
    pcVar15 = "expected structure or union";
    if (sym == (expression_list *)0x0) {
LAB_0010e729:
      dmrC_expression_error(C,expr,pcVar15);
      return (symbol *)0x0;
    }
    dmrC_examine_symbol_type(C->S,(symbol *)sym);
    if (*(char *)sym == '\x03') {
      sym = (expression_list *)sym->list_[0xc];
    }
    if (*(byte *)sym == 0xb) {
      sym = (expression_list *)dmrC_evaluate_expression(C,sym->list_[0x12]);
      if (sym == (expression_list *)0x0) {
        sym = (expression_list *)&C->S->bad_ctype;
      }
      else if (*(char *)sym == '\x03') {
        sym = (expression_list *)sym->list_[0xc];
      }
    }
    if (*(byte *)sym == 9) {
      sym = (expression_list *)sym->list_[0xc];
    }
    if (1 < *(byte *)sym - 7) goto LAB_0010e729;
    psVar9 = find_identifier((dmr_C *)(expr->field_5).field_10.cond_false,(ident *)sym->list_[0xf],
                             (symbol_list *)local_34,in_RCX);
    if (psVar9 == (symbol *)0x0) {
      pcVar15 = "unknown member";
      goto LAB_0010e729;
    }
    *(undefined2 *)expr = 0x101;
    *(long *)&expr->field_5 = (long)(int)local_34._0_4_;
LAB_0010e700:
    (expr->field_5).field_0.taint = 0;
    expr->ctype = C->target->size_t_ctype;
    goto LAB_0010e8ac;
  }
  if (sym == (expression_list *)0x0) {
    pcVar15 = "expected structure or union";
    goto LAB_0010e729;
  }
  dmrC_examine_symbol_type(C->S,(symbol *)sym);
  if (*(char *)sym == '\x03') {
    sym = (expression_list *)sym->list_[0xc];
  }
  if (*(char *)sym == '\v') {
    sym = (expression_list *)dmrC_evaluate_expression(C,sym->list_[0x12]);
    if (sym == (expression_list *)0x0) {
      sym = (expression_list *)&C->S->bad_ctype;
    }
    else if (*(char *)sym == '\x03') {
      sym = (expression_list *)sym->list_[0xc];
    }
  }
  if (*(char *)sym == '\t') {
    sym = (expression_list *)sym->list_[0xc];
  }
  if ((char)*(undefined4 *)sym != '\x06') {
    pcVar15 = "expected array";
    goto LAB_0010e729;
  }
  psVar9 = (symbol *)sym->list_[0xc];
  peVar11 = (expr->field_5).field_10.cond_false;
  if (peVar11 == (expression *)0x0) {
    *(undefined2 *)expr = 0x101;
    (expr->field_5).field_0.value = 0;
    goto LAB_0010e700;
  }
  psVar10 = dmrC_evaluate_expression(C,peVar11);
  if (*(char *)psVar10 == '\x03') {
    psVar10 = *(symbol **)((long)&psVar10->field_14 + 0x38);
  }
  if (*(byte *)psVar10 == 0xb) {
    psVar10 = dmrC_evaluate_expression(C,(psVar10->field_14).field_2.initializer);
    if (psVar10 == (symbol *)0x0) {
      psVar10 = &C->S->bad_ctype;
    }
    else if (*(char *)psVar10 == '\x03') {
      psVar10 = *(symbol **)((long)&psVar10->field_14 + 0x38);
    }
  }
  if (*(byte *)psVar10 == 9) {
    psVar10 = *(symbol **)((long)&psVar10->field_14 + 0x38);
  }
  if ((ulong)*(byte *)psVar10 == 2) {
    psVar3 = (psVar10->field_14).field_2.ctype.base_type;
    if (psVar3 == &C->S->int_type) {
      uVar14 = 1;
    }
    else {
      if (psVar3 != &C->S->fp_type) goto LAB_0010e784;
      uVar14 = 9;
    }
  }
  else {
LAB_0010e784:
    uVar14 = classify_type::type_class[*(byte *)psVar10];
  }
  if ((uVar14 & 9) == 1) {
    if ((uVar14 & 4) != 0) {
      if ((uVar14 & 0x40) != 0) {
        psVar10 = (psVar10->field_14).field_2.ctype.base_type;
      }
      pcVar15 = dmrC_show_typename(C,psVar10);
      dmrC_warning(C,peVar11->pos,"%s degrades to integer",pcVar15);
    }
    peVar11 = cast_to(C,peVar11,C->target->size_t_ctype);
    iVar1 = (psVar9->field_14).field_1.normal;
    if (iVar1 < 0) {
      local_40 = -1;
    }
    else {
      iVar2 = C->target->bits_in_char;
      local_40 = (long)((iVar1 + iVar2 + -1) / iVar2);
    }
    pVar4 = expr->pos;
    psVar12 = (string *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)psVar12 = 1;
    *(position *)(psVar12 + 2) = pVar4;
    *(long *)(psVar12 + 8) = local_40;
    *(symbol **)(psVar12 + 4) = &C->S->int_ctype;
    *(symbol **)(psVar12 + 4) = C->target->size_t_ctype;
    *(ushort *)psVar12 = 0x101;
    *(undefined1 *)expr = 5;
    (expr->field_5).field_3.unop = peVar11;
    (expr->field_5).field_2.string = psVar12;
    expr->op = 0x2a;
    expr->ctype = C->target->size_t_ctype;
    *(ushort *)expr = *(ushort *)psVar12 & *(ushort *)peVar11 & 0x100 | 5;
  }
  else {
    dmrC_expression_error(C,expr,"non-integer index");
  }
  if ((uVar14 & 9) != 1) {
    return (symbol *)0x0;
  }
LAB_0010e8ac:
  if (expr_00 != (expression *)0x0) {
    psVar13 = (symbol *)dmrC_allocator_allocate(&C->expression_allocator,0);
    uVar8 = *(undefined4 *)&expr->field_0x0;
    iVar1 = expr->op;
    pVar4 = expr->pos;
    psVar10 = expr->ctype;
    piVar5 = *(ident **)&expr->field_0x18;
    psVar3 = (symbol *)(expr->field_5).field_0.value;
    psVar6 = (symbol *)(expr->field_5).field_2.string;
    aVar7 = (anon_union_8_2_e1606681_for_symbol_12)(expr->field_5).field_14.ident_expression;
    psVar13->scope = (scope *)(expr->field_5).field_10.cond_false;
    psVar13->field_12 = aVar7;
    psVar13->next_id = psVar3;
    psVar13->replace = psVar6;
    *(symbol **)&(psVar13->endpos).field_0x4 = psVar10;
    psVar13->ident = piVar5;
    *(undefined4 *)&psVar13->field_0x0 = uVar8;
    *(int *)&(psVar13->pos).field_0x0 = iVar1;
    *(position *)&(psVar13->pos).field_0x4 = pVar4;
    if (*(char *)expr_00 == '\x1e') {
      (expr_00->field_5).field_4.symbol = psVar9;
    }
    psVar9 = dmrC_evaluate_expression(C,expr_00);
    if (psVar9 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    *(undefined1 *)expr = 5;
    *(ushort *)expr = *(ushort *)expr_00 & *(ushort *)psVar13 & 0x100 | 5;
    expr->op = 0x2b;
    expr->ctype = C->target->size_t_ctype;
    (expr->field_5).field_4.symbol = psVar13;
    (expr->field_5).field_6.right = expr_00;
  }
  return C->target->size_t_ctype;
}

Assistant:

static struct symbol *evaluate_offsetof(struct dmr_C *C, struct expression *expr)
{
	struct expression *e = expr->down;
	struct symbol *ctype = expr->in;
	int klass;

	if (expr->op == '.') {
		struct symbol *field;
		int offset = 0;
		if (!ctype) {
			dmrC_expression_error(C, expr, "expected structure or union");
			return NULL;
		}
		dmrC_examine_symbol_type(C->S, ctype);
		klass = classify_type(C, ctype, &ctype);
		if (klass != TYPE_COMPOUND) {
			dmrC_expression_error(C, expr, "expected structure or union");
			return NULL;
		}

		field = find_identifier(C, expr->ident, ctype->symbol_list, &offset);
		if (!field) {
			dmrC_expression_error(C, expr, "unknown member");
			return NULL;
		}
		ctype = field;
		expr->type = EXPR_VALUE;
		expr->flags = Int_const_expr;
		expr->value = offset;
		expr->taint = 0;
		expr->ctype = C->target->size_t_ctype;
	} else {
		if (!ctype) {
			dmrC_expression_error(C, expr, "expected structure or union");
			return NULL;
		}
		dmrC_examine_symbol_type(C->S, ctype);
		klass = classify_type(C, ctype, &ctype);
		if (klass != (TYPE_COMPOUND | TYPE_PTR)) {
			dmrC_expression_error(C, expr, "expected array");
			return NULL;
		}
		ctype = ctype->ctype.base_type;
		if (!expr->index) {
			expr->type = EXPR_VALUE;
			expr->flags = Int_const_expr;
			expr->value = 0;
			expr->taint = 0;
			expr->ctype = C->target->size_t_ctype;
		} else {
			struct expression *idx = expr->index, *m;
			struct symbol *i_type = dmrC_evaluate_expression(C, idx);
			int i_class = classify_type(C, i_type, &i_type);
			if (!is_int(i_class)) {
				dmrC_expression_error(C, expr, "non-integer index");
				return NULL;
			}
			unrestrict(C, idx, i_class, &i_type);
			idx = cast_to(C, idx, C->target->size_t_ctype);
			m = dmrC_alloc_const_expression(C, expr->pos,
						   dmrC_bits_to_bytes(C->target, ctype->bit_size));
			m->ctype = C->target->size_t_ctype;
			m->flags = Int_const_expr;
			expr->type = EXPR_BINOP;
			expr->left = idx;
			expr->right = m;
			expr->op = '*';
			expr->ctype = C->target->size_t_ctype;
			expr->flags = m->flags & idx->flags & Int_const_expr;
		}
	}
	if (e) {
		struct expression *copy = (struct expression *)dmrC_allocator_allocate(&C->expression_allocator, 0);
		*copy = *expr;
		if (e->type == EXPR_OFFSETOF)
			e->in = ctype;
		if (!dmrC_evaluate_expression(C, e))
			return NULL;
		expr->type = EXPR_BINOP;
		expr->flags = e->flags & copy->flags & Int_const_expr;
		expr->op = '+';
		expr->ctype = C->target->size_t_ctype;
		expr->left = copy;
		expr->right = e;
	}
	return C->target->size_t_ctype;
}